

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type-checker.cc
# Opt level: O0

Result __thiscall wabt::TypeChecker::OnSelect(TypeChecker *this,TypeVector *expected)

{
  Type expected_00;
  Type expected_01;
  bool bVar1;
  Result RVar2;
  size_type sVar3;
  const_reference pvVar4;
  Result local_50;
  Enum local_4c;
  Enum local_48;
  Type local_44;
  Enum local_3c;
  Type local_38;
  Type result_type;
  Type type2;
  Type type1;
  TypeVector *expected_local;
  TypeChecker *this_local;
  Result result;
  
  Result::Result((Result *)((long)&this_local + 4),Ok);
  Type::Type(&type2,Any);
  Type::Type(&result_type,Any);
  Type::Type(&local_38,Any);
  Type::Type(&local_44,I32);
  local_3c = (Enum)PeekAndCheckType(this,0,local_44);
  Result::operator|=((Result *)((long)&this_local + 4),(Result)local_3c);
  local_48 = (Enum)PeekType(this,1,&type2);
  Result::operator|=((Result *)((long)&this_local + 4),(Result)local_48);
  local_4c = (Enum)PeekType(this,2,&result_type);
  Result::operator|=((Result *)((long)&this_local + 4),(Result)local_4c);
  bVar1 = std::vector<wabt::Type,_std::allocator<wabt::Type>_>::empty(expected);
  if (bVar1) {
    bVar1 = Type::IsRef(&type2);
    if ((bVar1) || (bVar1 = Type::IsRef(&result_type), bVar1)) {
      Result::Result(&local_50,Error);
      this_local._4_4_ = local_50.enum_;
    }
    else {
      RVar2 = CheckType(type2,result_type);
      Result::operator|=((Result *)((long)&this_local + 4),RVar2);
      local_38 = type2;
    }
  }
  else {
    sVar3 = std::vector<wabt::Type,_std::allocator<wabt::Type>_>::size(expected);
    if (sVar3 != 1) {
      __assert_fail("expected.size() == 1",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/type-checker.cc"
                    ,0x362,"Result wabt::TypeChecker::OnSelect(const TypeVector &)");
    }
    pvVar4 = std::vector<wabt::Type,_std::allocator<wabt::Type>_>::operator[](expected,0);
    expected_00.enum_ = pvVar4->enum_;
    expected_00.type_index_ = pvVar4->type_index_;
    RVar2 = CheckType(type2,expected_00);
    Result::operator|=((Result *)((long)&this_local + 4),RVar2);
    pvVar4 = std::vector<wabt::Type,_std::allocator<wabt::Type>_>::operator[](expected,0);
    expected_01.enum_ = pvVar4->enum_;
    expected_01.type_index_ = pvVar4->type_index_;
    RVar2 = CheckType(result_type,expected_01);
    Result::operator|=((Result *)((long)&this_local + 4),RVar2);
  }
  PrintStackIfFailed<wabt::Type,wabt::Type,wabt::Type::Enum>
            (this,this_local._4_4_,"select",local_38,local_38,I32);
  RVar2 = DropTypes(this,3);
  Result::operator|=((Result *)((long)&this_local + 4),RVar2);
  PushType(this,local_38);
  return (Result)this_local._4_4_;
}

Assistant:

Result TypeChecker::OnSelect(const TypeVector& expected) {
  Result result = Result::Ok;
  Type type1 = Type::Any;
  Type type2 = Type::Any;
  Type result_type = Type::Any;
  result |= PeekAndCheckType(0, Type::I32);
  result |= PeekType(1, &type1);
  result |= PeekType(2, &type2);
  if (expected.empty()) {
    if (type1.IsRef() || type2.IsRef()) {
      result = Result::Error;
    } else {
      result |= CheckType(type1, type2);
      result_type = type1;
    }
  } else {
    assert(expected.size() == 1);
    result |= CheckType(type1, expected[0]);
    result |= CheckType(type2, expected[0]);
  }
  PrintStackIfFailed(result, "select", result_type, result_type, Type::I32);
  result |= DropTypes(3);
  PushType(result_type);
  return result;
}